

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_hog.c
# Opt level: O0

void * HOG_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  bool bVar1;
  int iVar2;
  int hog1;
  void *unpkarc;
  int *piStack_30;
  PHYSFS_uint8 buf [3];
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  bVar1 = false;
  piStack_30 = claimed;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_hog.c"
                  ,0x76,"void *HOG_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar2 = __PHYSFS_readAll(io,(void *)((long)&unpkarc + 5),3);
    if (iVar2 == 0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      iVar2 = memcmp((void *)((long)&unpkarc + 5),"DHF",3);
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        iVar2 = memcmp((void *)((long)&unpkarc + 5),"HOG",3);
        if (iVar2 != 0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
          return (void *)0x0;
        }
        iVar2 = __PHYSFS_readAll(io,(void *)((long)&unpkarc + 5),1);
        if (iVar2 == 0) {
          return (void *)0x0;
        }
        if (unpkarc._5_1_ != '2') {
          PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
          return (void *)0x0;
        }
      }
      *piStack_30 = 1;
      io_local = (PHYSFS_Io *)UNPK_openArchive(io,0,1);
      if (io_local == (PHYSFS_Io *)0x0) {
        io_local = (PHYSFS_Io *)0x0;
      }
      else {
        if (bVar1) {
          iVar2 = hog1LoadEntries(io,io_local);
        }
        else {
          iVar2 = hog2LoadEntries(io,io_local);
        }
        if (iVar2 == 0) {
          UNPK_abandonArchive(io_local);
          io_local = (PHYSFS_Io *)0x0;
        }
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *HOG_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[3];
    void *unpkarc = NULL;
    int hog1 = 0;

    assert(io != NULL);  /* shouldn't ever happen. */
    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 3), NULL);

    if (memcmp(buf, "DHF", 3) == 0)
        hog1 = 1;  /* original HOG (Descent 1 and 2) archive */
    else
    {
        BAIL_IF(memcmp(buf, "HOG", 3) != 0, PHYSFS_ERR_UNSUPPORTED, NULL); /* Not HOG2 */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 1), NULL);
        BAIL_IF(buf[0] != '2', PHYSFS_ERR_UNSUPPORTED, NULL); /* Not HOG2 */
    } /* else */

    *claimed = 1;

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!(hog1 ? hog1LoadEntries(io, unpkarc) : hog2LoadEntries(io, unpkarc)))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}